

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

void vkt::anon_unknown_0::logTestCaseInfo
               (TestLog *log,TestConfig *config,
               vector<bool,_std::allocator<bool>_> *attachmentIsLazy,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *imageClearValues,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *renderPassClearValues,
               vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
               *subpassRenderInfo)

{
  ScopedLogSection SVar1;
  TestConfig *pTVar2;
  const_reference cVar3;
  bool bVar4;
  VkAttachmentLoadOp VVar5;
  VkFormat VVar6;
  MessageBuilder *pMVar7;
  TestLog *pTVar8;
  const_reference pvVar9;
  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
  *pvVar10;
  const_reference pvVar11;
  VkClearValue *pVVar12;
  vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
  *this;
  const_reference info;
  VkClearValue value;
  VkClearValue value_00;
  string local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  string local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  ScopedLogSection local_8d8;
  ScopedLogSection section_1;
  size_t subpassNdx;
  string local_8b8;
  MessageBuilder local_898;
  VkClearDepthStencilValue local_718;
  undefined8 uStack_710;
  string local_700;
  MessageBuilder local_6e0;
  MessageBuilder local_560;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  ScopedLogSection local_360;
  ScopedLogSection section;
  size_t attachmentNdx;
  MessageBuilder local_1c0;
  TestConfig *local_40;
  RenderPass *renderPass;
  vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
  *subpassRenderInfo_local;
  vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
  *renderPassClearValues_local;
  vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
  *imageClearValues_local;
  vector<bool,_std::allocator<bool>_> *attachmentIsLazy_local;
  TestConfig *config_local;
  TestLog *log_local;
  
  local_40 = config;
  renderPass = (RenderPass *)subpassRenderInfo;
  subpassRenderInfo_local =
       (vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
        *)renderPassClearValues;
  renderPassClearValues_local = imageClearValues;
  imageClearValues_local =
       (vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_> *)
       attachmentIsLazy;
  attachmentIsLazy_local = (vector<bool,_std::allocator<bool>_> *)config;
  config_local = (TestConfig *)log;
  logRenderPassInfo(log,&config->renderPass);
  tcu::TestLog::operator<<
            (&local_1c0,(TestLog *)config_local,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [13])"TargetSize: ");
  pMVar7 = tcu::MessageBuilder::operator<<
                     (pMVar7,(Vector<unsigned_int,_2> *)
                             ((long)&attachmentIsLazy_local[2].
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + 4));
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&attachmentNdx,(TestLog *)config_local,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&attachmentNdx,(char (*) [22])"Render area, Offset: ");
  pMVar7 = tcu::MessageBuilder::operator<<
                     (pMVar7,(Vector<unsigned_int,_2> *)
                             &attachmentIsLazy_local[2].super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                              field_0xc);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])0x1359699);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (pMVar7,(Vector<unsigned_int,_2> *)
                             ((long)&attachmentIsLazy_local[2].
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                     _M_p + 4));
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&attachmentNdx);
  for (section.m_log = (TestLog *)0x0; SVar1.m_log = section.m_log,
      pTVar8 = (TestLog *)
               std::vector<bool,_std::allocator<bool>_>::size
                         ((vector<bool,_std::allocator<bool>_> *)imageClearValues_local),
      pTVar2 = config_local, SVar1.m_log < pTVar8;
      section.m_log = (TestLog *)((long)&(section.m_log)->m_log + 1)) {
    de::toString<unsigned_long>(&local_3a0,(unsigned_long *)&section);
    std::operator+(&local_380,"Attachment",&local_3a0);
    de::toString<unsigned_long>(&local_3e0,(unsigned_long *)&section);
    std::operator+(&local_3c0,"Attachment ",&local_3e0);
    tcu::ScopedLogSection::ScopedLogSection(&local_360,(TestLog *)pTVar2,&local_380,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)imageClearValues_local,
                       (size_type)section.m_log);
    if (cVar3) {
      tcu::TestLog::operator<<
                (&local_560,(TestLog *)config_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_560,(char (*) [9])"Is lazy.");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_560);
    }
    pvVar9 = std::
             vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>::
             operator[](renderPassClearValues_local,(size_type)section.m_log);
    bVar4 = tcu::Maybe::operator_cast_to_bool((Maybe *)pvVar9);
    if (bVar4) {
      tcu::TestLog::operator<<
                (&local_6e0,(TestLog *)config_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_6e0,(char (*) [21])"Image is cleared to ");
      pvVar10 = RenderPass::getAttachments(&local_40->renderPass);
      pvVar11 = std::
                vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                ::operator[](pvVar10,(size_type)section.m_log);
      VVar6 = Attachment::getFormat(pvVar11);
      pvVar9 = std::
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               ::operator[](renderPassClearValues_local,(size_type)section.m_log);
      pVVar12 = tcu::Maybe<vk::VkClearValue>::operator*(pvVar9);
      local_718 = pVVar12->depthStencil;
      uStack_710 = *(undefined8 *)((long)pVVar12 + 8);
      value._8_8_ = renderPassClearValues;
      value._0_4_ = (float)(int)uStack_710;
      value._4_4_ = (int)((ulong)uStack_710 >> 0x20);
      vkt::(anonymous_namespace)::clearValueToString_abi_cxx11_
                (&local_700,(_anonymous_namespace_ *)(ulong)VVar6,(VkFormat)local_718.depth,value);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_700);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [19])" before rendering.");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_700);
      tcu::MessageBuilder::~MessageBuilder(&local_6e0);
    }
    pvVar10 = RenderPass::getAttachments(&local_40->renderPass);
    pvVar11 = std::
              vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
              ::operator[](pvVar10,(size_type)section.m_log);
    VVar5 = Attachment::getLoadOp(pvVar11);
    if (VVar5 == VK_ATTACHMENT_LOAD_OP_CLEAR) {
      pvVar9 = std::
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               ::operator[]((vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                             *)subpassRenderInfo_local,(size_type)section.m_log);
      bVar4 = tcu::Maybe::operator_cast_to_bool((Maybe *)pvVar9);
      if (bVar4) {
        tcu::TestLog::operator<<
                  (&local_898,(TestLog *)config_local,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_898,(char (*) [26])"Attachment is cleared to ");
        pvVar10 = RenderPass::getAttachments(&local_40->renderPass);
        pvVar11 = std::
                  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                  ::operator[](pvVar10,(size_type)section.m_log);
        VVar6 = Attachment::getFormat(pvVar11);
        pvVar9 = std::
                 vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                 ::operator[]((vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
                               *)subpassRenderInfo_local,(size_type)section.m_log);
        pVVar12 = tcu::Maybe<vk::VkClearValue>::operator*(pvVar9);
        value_00._8_8_ = renderPassClearValues;
        value_00.depthStencil = (VkClearDepthStencilValue)*(undefined8 *)((long)pVVar12 + 8);
        vkt::(anonymous_namespace)::clearValueToString_abi_cxx11_
                  (&local_8b8,(_anonymous_namespace_ *)(ulong)VVar6,
                   (VkFormat)(pVVar12->depthStencil).depth,value_00);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_8b8);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [38])" in the beginning of the render pass.");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_8b8);
        tcu::MessageBuilder::~MessageBuilder(&local_898);
      }
    }
    tcu::ScopedLogSection::~ScopedLogSection(&local_360);
  }
  section_1.m_log = (TestLog *)0x0;
  while( true ) {
    SVar1.m_log = section_1.m_log;
    this = RenderPass::getSubpasses(&local_40->renderPass);
    pTVar8 = (TestLog *)
             std::
             vector<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
             ::size(this);
    pTVar2 = config_local;
    if (pTVar8 <= SVar1.m_log) break;
    de::toString<unsigned_long>(&local_918,(unsigned_long *)&section_1);
    std::operator+(&local_8f8,"Subpass",&local_918);
    de::toString<unsigned_long>(&local_958,(unsigned_long *)&section_1);
    std::operator+(&local_938,"Subpass ",&local_958);
    tcu::ScopedLogSection::ScopedLogSection(&local_8d8,(TestLog *)pTVar2,&local_8f8,&local_938);
    std::__cxx11::string::~string((string *)&local_938);
    std::__cxx11::string::~string((string *)&local_958);
    std::__cxx11::string::~string((string *)&local_8f8);
    std::__cxx11::string::~string((string *)&local_918);
    pTVar2 = config_local;
    info = std::
           vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
           ::operator[]((vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
                         *)renderPass,(size_type)section_1.m_log);
    logSubpassRenderInfo((TestLog *)pTVar2,info);
    tcu::ScopedLogSection::~ScopedLogSection(&local_8d8);
    section_1.m_log = (TestLog *)((long)&(section_1.m_log)->m_log + 1);
  }
  return;
}

Assistant:

void logTestCaseInfo (TestLog&								log,
					  const TestConfig&						config,
					  const vector<bool>&					attachmentIsLazy,
					  const vector<Maybe<VkClearValue> >&	imageClearValues,
					  const vector<Maybe<VkClearValue> >&	renderPassClearValues,
					  const vector<SubpassRenderInfo>&		subpassRenderInfo)
{
	const RenderPass&	renderPass	= config.renderPass;

	logRenderPassInfo(log, renderPass);

	DE_ASSERT(attachmentIsLazy.size() == renderPass.getAttachments().size());
	DE_ASSERT(imageClearValues.size() == renderPass.getAttachments().size());
	DE_ASSERT(renderPassClearValues.size() == renderPass.getAttachments().size());

	log << TestLog::Message << "TargetSize: " << config.targetSize << TestLog::EndMessage;
	log << TestLog::Message << "Render area, Offset: " << config.renderPos << ", Size: " << config.renderSize << TestLog::EndMessage;

	for (size_t attachmentNdx = 0; attachmentNdx < attachmentIsLazy.size(); attachmentNdx++)
	{
		const tcu::ScopedLogSection	section	(log, "Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx));

		if (attachmentIsLazy[attachmentNdx])
			log << TestLog::Message << "Is lazy." << TestLog::EndMessage;

		if (imageClearValues[attachmentNdx])
			log << TestLog::Message << "Image is cleared to " << clearValueToString(renderPass.getAttachments()[attachmentNdx].getFormat(), *imageClearValues[attachmentNdx]) << " before rendering." << TestLog::EndMessage;

		if (renderPass.getAttachments()[attachmentNdx].getLoadOp() == VK_ATTACHMENT_LOAD_OP_CLEAR && renderPassClearValues[attachmentNdx])
			log << TestLog::Message << "Attachment is cleared to " << clearValueToString(renderPass.getAttachments()[attachmentNdx].getFormat(), *renderPassClearValues[attachmentNdx]) << " in the beginning of the render pass." << TestLog::EndMessage;
	}

	for (size_t subpassNdx = 0; subpassNdx < renderPass.getSubpasses().size(); subpassNdx++)
	{
		const tcu::ScopedLogSection section (log, "Subpass" + de::toString(subpassNdx), "Subpass " + de::toString(subpassNdx));

		logSubpassRenderInfo(log, subpassRenderInfo[subpassNdx]);
	}
}